

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_msg_generator.c
# Opt level: O1

void rfc5444_writer_set_msg_header
               (rfc5444_writer *writer,rfc5444_writer_message *msg,_Bool has_originator,
               _Bool has_hopcount,_Bool has_hoplimit,_Bool has_seqno)

{
  size_t *psVar1;
  
  if (writer->_state == RFC5444_WRITER_ADD_HEADER) {
    msg->has_origaddr = has_originator;
    msg->has_hoplimit = has_hoplimit;
    msg->has_hopcount = has_hopcount;
    msg->has_seqno = has_seqno;
    (writer->_msg).header = 6;
    if (has_originator) {
      (writer->_msg).header = (ulong)writer->msg_addr_len + 6;
    }
    if (has_hoplimit) {
      psVar1 = &(writer->_msg).header;
      *psVar1 = *psVar1 + 1;
    }
    if (has_hopcount) {
      psVar1 = &(writer->_msg).header;
      *psVar1 = *psVar1 + 1;
    }
    if (has_seqno) {
      psVar1 = &(writer->_msg).header;
      *psVar1 = *psVar1 + 2;
    }
    return;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_ADD_HEADER",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_msg_generator.c"
                ,699,
                "void rfc5444_writer_set_msg_header(struct rfc5444_writer *, struct rfc5444_writer_message *, _Bool, _Bool, _Bool, _Bool)"
               );
}

Assistant:

void
rfc5444_writer_set_msg_header(struct rfc5444_writer *writer, struct rfc5444_writer_message *msg, bool has_originator,
  bool has_hopcount, bool has_hoplimit, bool has_seqno) {
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_ADD_HEADER);
#endif

  msg->has_origaddr = has_originator;
  msg->has_hoplimit = has_hoplimit;
  msg->has_hopcount = has_hopcount;
  msg->has_seqno = has_seqno;

  /* fixed parts: _msg type, flags, length, tlvblock-length */
  writer->_msg.header = 6;

  if (has_originator) {
    writer->_msg.header += writer->msg_addr_len;
  }
  if (has_hoplimit) {
    writer->_msg.header++;
  }
  if (has_hopcount) {
    writer->_msg.header++;
  }
  if (has_seqno) {
    writer->_msg.header += 2;
  }
}